

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall
kratos::VarExtend::VarExtend(VarExtend *this,shared_ptr<kratos::Var> *var,uint32_t width)

{
  element_type *peVar1;
  Var *pVVar2;
  uint *puVar3;
  uint uVar4;
  VarException *pVVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  string local_b8;
  ulong local_98;
  string local_80;
  Var *local_60;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_58;
  allocator_type local_29;
  
  Expr::Expr(&this->super_Expr,Extend,
             (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,(Var *)0x0);
  (this->super_Expr).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b72e8;
  peVar1 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->parent_ = peVar1;
  uVar4 = (*(peVar1->super_IRNode)._vptr_IRNode[7])();
  if (width < uVar4) {
    pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
    (*(this->parent_->super_IRNode)._vptr_IRNode[0x1f])(&local_58);
    uVar4 = (*(this->parent_->super_IRNode)._vptr_IRNode[7])();
    local_b8.field_2._M_allocated_capacity = (size_type)uVar4;
    local_98 = (ulong)width;
    local_b8._M_dataplus._M_p =
         (pointer)local_58.
                  super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_b8._M_string_length =
         (size_type)
         local_58.
         super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    format_str_00.size_ = 0x22d;
    format_str_00.data_ = (char *)0x24;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_b8;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_80,(detail *)"Cannot extend {0} (width={1}) to {2}",format_str_00,args_00);
    local_60 = this->parent_;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_60;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)&local_b8,
               __l_00,&local_29);
    VarException::VarException
              (pVVar5,&local_80,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)&local_b8)
    ;
    __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  (this->super_Expr).super_Var.var_width_ = width;
  pVVar2 = this->parent_;
  (this->super_Expr).super_Var.is_signed_ = pVVar2->is_signed_;
  puVar3 = (pVVar2->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((((ulong)((long)(pVVar2->size_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3) < 5) && (*puVar3 < 2)) &&
     ((pVVar2->explicit_array_ != true || (pVVar2->type_ == ConstValue)))) {
    return;
  }
  pVVar5 = (VarException *)__cxa_allocate_exception(0x10);
  (*(this->parent_->super_IRNode)._vptr_IRNode[0x1f])(&local_80);
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_80._M_dataplus._M_p;
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_80._M_string_length;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x1c;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_b8,(detail *)"Cannot extend an array ({0})",format_str,args);
  local_60 = this->parent_;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_60;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_58,__l,&local_29);
  VarException::VarException(pVVar5,&local_b8,&local_58);
  __cxa_throw(pVVar5,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

VarExtend::VarExtend(const std::shared_ptr<Var> &var, uint32_t width)
    : Expr(ExprOp::Extend, var.get(), nullptr), parent_(var.get()) {
    if (width < parent_->width()) {
        throw VarException(::format("Cannot extend {0} (width={1}) to {2}", parent_->to_string(),
                                    parent_->width(), width),
                           {parent_});
    }
    var_width_ = width;
    is_signed_ = parent_->is_signed();
    if (parent_->size().size() > 1 || parent_->size().front() > 1 ||
        (parent_->explicit_array() && parent_->type() != VarType::ConstValue)) {
        throw VarException(::format("Cannot extend an array ({0})", parent_->to_string()),
                           {parent_});
    }
}